

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

uint __thiscall
RealtimeHelper::getPlayingNotes(RealtimeHelper *this,uint partNumber,Bit8u *keys,Bit8u *velocities)

{
  bool bVar1;
  Bit32u playingNotesCount;
  QMutexLocker<QMutex> stateSnapshotLocker;
  Bit8u *velocities_local;
  Bit8u *keys_local;
  uint partNumber_local;
  RealtimeHelper *this_local;
  
  stateSnapshotLocker._8_8_ = velocities;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)&playingNotesCount,&this->stateSnapshotMutex);
  bVar1 = QSynth::isOpen(this->qsynth);
  if (bVar1) {
    this_local._4_4_ = (this->stateSnapshot).partStates[partNumber].playingNotesCount;
    memcpy(keys,(this->stateSnapshot).partStates[partNumber].keysOfPlayingNotes,
           (ulong)this_local._4_4_);
    memcpy((void *)stateSnapshotLocker._8_8_,
           (this->stateSnapshot).partStates[partNumber].velocitiesOfPlayingNotes,
           (ulong)this_local._4_4_);
  }
  else {
    this_local._4_4_ = 0;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)&playingNotesCount);
  return this_local._4_4_;
}

Assistant:

uint getPlayingNotes(uint partNumber, Bit8u *keys, Bit8u *velocities) {
		QMutexLocker stateSnapshotLocker(&stateSnapshotMutex);
		if (!qsynth.isOpen()) return 0;
		Bit32u playingNotesCount = stateSnapshot.partStates[partNumber].playingNotesCount;
		memcpy(keys, stateSnapshot.partStates[partNumber].keysOfPlayingNotes, playingNotesCount * sizeof(Bit8u));
		memcpy(velocities, stateSnapshot.partStates[partNumber].velocitiesOfPlayingNotes, playingNotesCount * sizeof(Bit8u));
		return playingNotesCount;
	}